

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.hpp
# Opt level: O1

void __thiscall
skiplist<int,_std::less<int>_>::destroy_all_levels(skiplist<int,_std::less<int>_> *this)

{
  pointer ppSVar1;
  SLNode<int> *pSVar2;
  pointer piVar3;
  SLNode<int> *pSVar4;
  vector<SLNode<int>_*,_std::allocator<SLNode<int>_*>_> *__range2;
  pointer ppSVar5;
  
  ppSVar1 = (this->key).super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppSVar5 = (this->key).super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppSVar5 != ppSVar1; ppSVar5 = ppSVar5 + 1
      ) {
    pSVar4 = *ppSVar5;
    while (pSVar4 != (SLNode<int> *)0x0) {
      pSVar2 = pSVar4->next;
      piVar3 = (pSVar4->valz).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (piVar3 != (pointer)0x0) {
        operator_delete(piVar3);
      }
      operator_delete(pSVar4);
      pSVar4 = pSVar2;
    }
  }
  ppSVar5 = (this->key).super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->key).super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppSVar5) {
    (this->key).super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppSVar5;
  }
  return;
}

Assistant:

void destroy_all_levels() {
        SLNode<val_type> *tmp;
        for(auto level: key)
            while(level) {
                tmp = level->next;
                delete level;
                level = tmp;
            }
        key.clear();
    }